

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::
BasicTypeInfo<std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>_>
::~BasicTypeInfo(BasicTypeInfo<std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>_>
                 *this)

{
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}